

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_aligned.h
# Opt level: O1

Split * __thiscall
embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
          (Split *__return_storage_ptr__,HeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,
          SetMB *set,size_t logBlockSize)

{
  float fVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  int iVar11;
  unsigned_long uVar12;
  __m128 afVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char cVar18;
  long lVar19;
  ulong uVar20;
  runtime_error *this_00;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  int iVar23;
  long lVar24;
  long lVar25;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar26;
  long lVar27;
  unsigned_long uVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  vuint4 vbestPos;
  BinMapping<32UL> mapping;
  task_group_context context;
  ObjectBinner binner;
  vfloat4 rAreas [32];
  float local_37d0;
  float fStack_37cc;
  float fStack_37c8;
  float fStack_37c4;
  anon_class_16_2_ed117de8_conflict16 local_3760;
  anon_class_8_1_b5464bae local_3750;
  PrimRefMB *local_3748;
  undefined1 local_3740 [32];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3720;
  blocked_range<unsigned_long> local_3710 [3];
  float local_36c0;
  float fStack_36bc;
  float fStack_36b8;
  float fStack_36b4;
  anon_class_16_2_be24578a_conflict local_3690;
  task_group_context local_3680 [3];
  undefined1 auStack_3490 [16];
  undefined1 local_3480 [6652];
  undefined4 uStack_1a84;
  undefined1 local_1a80 [20];
  float afStack_1a6c [1679];
  undefined1 auVar49 [64];
  undefined1 auVar52 [64];
  
  lVar19 = 0x1800;
  pauVar22 = (undefined1 (*) [16])(local_3480 + 0xb0);
  auVar47._8_4_ = 0x7f800000;
  auVar47._0_8_ = 0x7f8000007f800000;
  auVar47._12_4_ = 0x7f800000;
  auVar49 = ZEXT1664(auVar47);
  auVar50._8_4_ = 0xff800000;
  auVar50._0_8_ = 0xff800000ff800000;
  auVar50._12_4_ = 0xff800000;
  auVar52 = ZEXT1664(auVar50);
  do {
    pauVar22[-3] = auVar47;
    pauVar22[-2] = auVar50;
    pauVar22[-1] = auVar47;
    *pauVar22 = auVar50;
    pauVar22[-7] = auVar47;
    pauVar22[-6] = auVar50;
    pauVar22[-5] = auVar47;
    pauVar22[-4] = auVar50;
    pauVar22[-0xb] = auVar47;
    pauVar22[-10] = auVar50;
    pauVar22[-9] = auVar47;
    pauVar22[-8] = auVar50;
    *(undefined8 *)(local_3480 + lVar19) = 0;
    *(undefined8 *)(local_3480 + lVar19 + 8) = 0;
    lVar19 = lVar19 + 0x10;
    pauVar22 = pauVar22 + 0xc;
  } while (lVar19 != 0x1a00);
  uVar12 = (set->super_PrimInfoMB).object_range._begin;
  uVar28 = (set->super_PrimInfoMB).object_range._end;
  uVar20 = uVar28 - uVar12;
  fVar29 = (float)uVar20 * 0.05 + 4.0;
  uVar21 = (ulong)fVar29;
  uVar21 = (long)(fVar29 - 9.223372e+18) & (long)uVar21 >> 0x3f | uVar21;
  local_3740._0_8_ = 0x20;
  if (uVar21 < 0x20) {
    local_3740._0_8_ = uVar21;
  }
  local_3740._16_16_ =
       *(undefined1 (*) [16])
        (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
        field_0.m128;
  auVar47 = vsubps_avx((undefined1  [16])
                       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       centBounds.upper.field_0,local_3740._16_16_);
  auVar36._8_4_ = 0x704ec3d;
  auVar36._0_8_ = 0x704ec3d0704ec3d;
  auVar36._12_4_ = 0x704ec3d;
  auVar50 = vmaxps_avx(auVar36,auVar47);
  auVar47 = vcmpps_avx(auVar50,auVar36,6);
  auVar36 = vshufps_avx(ZEXT416((uint)((float)(long)local_3740._0_8_ * 0.99)),
                        ZEXT416((uint)((float)(long)local_3740._0_8_ * 0.99)),0);
  auVar50 = vdivps_avx(auVar36,auVar50);
  afVar13 = (__m128)vandps_avx(auVar47,auVar50);
  local_3720.i[0] = (int)afVar13[0];
  local_3720.i[1] = (int)afVar13[1];
  local_3720.i[2] = (int)afVar13[2];
  local_3720.i[3] = (int)afVar13[3];
  local_3748 = set->prims->items;
  if (uVar20 < 0xc00) {
    if (uVar28 != uVar12) {
      local_37d0 = afVar13[0];
      fStack_37cc = afVar13[1];
      fStack_37c8 = afVar13[2];
      fStack_37c4 = afVar13[3];
      if (uVar20 == 1) {
        uVar21 = 0;
      }
      else {
        auVar47 = vpshufd_avx(ZEXT416((int)local_3740._0_8_ - 1),0);
        paVar26 = &local_3748[uVar12 + 1].lbounds.bounds1.upper.field_0;
        uVar21 = 0;
        do {
          aVar3 = paVar26[-8].field_1;
          aVar4 = paVar26[-7].field_1;
          aVar5 = paVar26[-6].field_1;
          aVar6 = paVar26[-5].field_1;
          auVar42._0_4_ = aVar3.x * 0.5 + aVar5.x * 0.5 + aVar4.x * 0.5 + aVar6.x * 0.5;
          auVar42._4_4_ = aVar3.y * 0.5 + aVar5.y * 0.5 + aVar4.y * 0.5 + aVar6.y * 0.5;
          auVar42._8_4_ = aVar3.z * 0.5 + aVar5.z * 0.5 + aVar4.z * 0.5 + aVar6.z * 0.5;
          auVar42._12_4_ =
               aVar3.field_3.w * 0.5 + aVar5.field_3.w * 0.5 +
               aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5;
          auVar50 = vsubps_avx(auVar42,local_3740._16_16_);
          auVar43._0_4_ = local_37d0 * auVar50._0_4_;
          auVar43._4_4_ = fStack_37cc * auVar50._4_4_;
          auVar43._8_4_ = fStack_37c8 * auVar50._8_4_;
          auVar43._12_4_ = fStack_37c4 * auVar50._12_4_;
          auVar50 = vroundps_avx(auVar43,1);
          auVar50 = vcvtps2dq_avx(auVar50);
          auVar50 = vpminsd_avx(auVar50,auVar47);
          auVar42 = vpmaxsd_avx(auVar50,ZEXT816(0) << 0x40);
          aVar7 = paVar26[-3].field_1;
          aVar8 = paVar26[-2].field_1;
          aVar9 = paVar26[-1].field_1;
          aVar10 = paVar26->field_1;
          lVar27 = CONCAT44((int)(uVar28 >> 0x20),auVar42._0_4_);
          auVar51._0_4_ = aVar7.x * 0.5 + aVar9.x * 0.5 + aVar8.x * 0.5 + aVar10.x * 0.5;
          auVar51._4_4_ = aVar7.y * 0.5 + aVar9.y * 0.5 + aVar8.y * 0.5 + aVar10.y * 0.5;
          auVar51._8_4_ = aVar7.z * 0.5 + aVar9.z * 0.5 + aVar8.z * 0.5 + aVar10.z * 0.5;
          auVar51._12_4_ =
               aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5 +
               aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5;
          lVar19 = lVar27 * 0xc0;
          auVar36 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19),(undefined1  [16])aVar3);
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x10),
                               (undefined1  [16])aVar4);
          *(undefined1 (*) [16])(local_3480 + lVar19) = auVar36;
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x10) = auVar50;
          auVar36 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x20),
                               (undefined1  [16])aVar5);
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x30),
                               (undefined1  [16])aVar6);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x20) = auVar36;
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x30) = auVar50;
          lVar19 = (ulong)auVar42._4_4_ * 0xc0;
          auVar50 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x40),
                               (undefined1  [16])aVar3);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x40) = auVar50;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x50),
                               (undefined1  [16])aVar4);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x50) = auVar50;
          auVar50 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x60),
                               (undefined1  [16])aVar5);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x60) = auVar50;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x70),
                               (undefined1  [16])aVar6);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x70) = auVar50;
          lVar19 = (ulong)auVar42._8_4_ * 0xc0;
          auVar36 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x80),
                               (undefined1  [16])aVar3);
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x90),
                               (undefined1  [16])aVar4);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x80) = auVar36;
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x90) = auVar50;
          auVar50 = vsubps_avx(auVar51,local_3740._16_16_);
          auVar30._0_4_ = local_37d0 * auVar50._0_4_;
          auVar30._4_4_ = fStack_37cc * auVar50._4_4_;
          auVar30._8_4_ = fStack_37c8 * auVar50._8_4_;
          auVar30._12_4_ = fStack_37c4 * auVar50._12_4_;
          auVar50 = vroundps_avx(auVar30,1);
          auVar50 = vcvtps2dq_avx(auVar50);
          auVar36 = vpminsd_avx(auVar50,auVar47);
          auVar50 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0xa0),
                               (undefined1  [16])aVar5);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0xa0) = auVar50;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0xb0),
                               (undefined1  [16])aVar6);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0xb0) = auVar50;
          iVar23 = *(int *)((long)paVar26 + -0x54);
          auVar30 = vpmaxsd_avx(auVar36,_DAT_01feba10);
          lVar27 = lVar27 * 0x10;
          *(int *)(local_3480 + lVar27 + 0x1800) = *(int *)(local_3480 + lVar27 + 0x1800) + iVar23;
          *(int *)(local_3480 + (ulong)auVar42._4_4_ * 0x10 + 0x1804) =
               *(int *)(local_3480 + (ulong)auVar42._4_4_ * 0x10 + 0x1804) + iVar23;
          *(int *)(local_3480 + (ulong)auVar42._8_4_ * 0x10 + 0x1808) =
               *(int *)(local_3480 + (ulong)auVar42._8_4_ * 0x10 + 0x1808) + iVar23;
          lVar27 = CONCAT44((int)((ulong)lVar27 >> 0x20),auVar30._0_4_);
          lVar19 = lVar27 * 0xc0;
          auVar50 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19),(undefined1  [16])aVar7);
          *(undefined1 (*) [16])(local_3480 + lVar19) = auVar50;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x10),
                               (undefined1  [16])aVar8);
          auVar36 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x20),
                               (undefined1  [16])aVar9);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x10) = auVar50;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x30),
                               (undefined1  [16])aVar10);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x20) = auVar36;
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x30) = auVar50;
          lVar19 = (ulong)auVar30._4_4_ * 0xc0;
          auVar50 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x40),
                               (undefined1  [16])aVar7);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x40) = auVar50;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x50),
                               (undefined1  [16])aVar8);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x50) = auVar50;
          auVar36 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x60),
                               (undefined1  [16])aVar9);
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x70),
                               (undefined1  [16])aVar10);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x60) = auVar36;
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x70) = auVar50;
          lVar19 = (ulong)auVar30._8_4_ * 0xc0;
          auVar50 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x80),
                               (undefined1  [16])aVar7);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x80) = auVar50;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x90),
                               (undefined1  [16])aVar8);
          auVar36 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0xa0),
                               (undefined1  [16])aVar9);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0x90) = auVar50;
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0xa0) = auVar36;
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0xb0),
                               (undefined1  [16])aVar10);
          *(undefined1 (*) [16])(local_3480 + lVar19 + 0xb0) = auVar50;
          iVar23 = *(int *)((long)paVar26 + -4);
          uVar28 = lVar27 * 0x10;
          *(int *)(local_3480 + uVar28 + 0x1800) = *(int *)(local_3480 + uVar28 + 0x1800) + iVar23;
          *(int *)(local_3480 + (ulong)auVar30._4_4_ * 0x10 + 0x1804) =
               *(int *)(local_3480 + (ulong)auVar30._4_4_ * 0x10 + 0x1804) + iVar23;
          *(int *)(local_3480 + (ulong)auVar30._8_4_ * 0x10 + 0x1808) =
               *(int *)(local_3480 + (ulong)auVar30._8_4_ * 0x10 + 0x1808) + iVar23;
          uVar21 = uVar21 + 2;
          paVar26 = paVar26 + 10;
        } while (uVar21 < uVar20 - 1);
      }
      auVar49 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar52 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      if (uVar21 < uVar20) {
        aVar3 = local_3748[uVar12 + uVar21].lbounds.bounds0.lower.field_0.field_1;
        aVar4 = local_3748[uVar12 + uVar21].lbounds.bounds0.upper.field_0.field_1;
        aVar5 = local_3748[uVar12 + uVar21].lbounds.bounds1.lower.field_0.field_1;
        aVar6 = local_3748[uVar12 + uVar21].lbounds.bounds1.upper.field_0.field_1;
        auVar31._0_4_ = aVar3.x * 0.5 + aVar5.x * 0.5 + aVar4.x * 0.5 + aVar6.x * 0.5;
        auVar31._4_4_ = aVar3.y * 0.5 + aVar5.y * 0.5 + aVar4.y * 0.5 + aVar6.y * 0.5;
        auVar31._8_4_ = aVar3.z * 0.5 + aVar5.z * 0.5 + aVar4.z * 0.5 + aVar6.z * 0.5;
        auVar31._12_4_ =
             aVar3.field_3.w * 0.5 + aVar5.field_3.w * 0.5 +
             aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5;
        auVar47 = vsubps_avx(auVar31,local_3740._16_16_);
        auVar32._0_4_ = auVar47._0_4_ * local_37d0;
        auVar32._4_4_ = auVar47._4_4_ * fStack_37cc;
        auVar32._8_4_ = auVar47._8_4_ * fStack_37c8;
        auVar32._12_4_ = auVar47._12_4_ * fStack_37c4;
        auVar47 = vroundps_avx(auVar32,1);
        auVar47 = vcvtps2dq_avx(auVar47);
        auVar50 = vpshufd_avx(ZEXT416((int)local_3740._0_8_ - 1),0);
        auVar47 = vpminsd_avx(auVar47,auVar50);
        auVar50 = vpmaxsd_avx(auVar47,(undefined1  [16])0x0);
        iVar23 = *(int *)((long)&local_3748[uVar12 + uVar21].lbounds.bounds1.lower.field_0 + 0xc);
        *(int *)(local_3480 + (ulong)auVar50._0_4_ * 0x10 + 0x1800) =
             *(int *)(local_3480 + (ulong)auVar50._0_4_ * 0x10 + 0x1800) + iVar23;
        lVar19 = (ulong)auVar50._0_4_ * 0xc0;
        auVar47 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_3480 + lVar19) = auVar47;
        auVar47 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x10),
                             (undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x10) = auVar47;
        auVar47 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x20),
                             (undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x20) = auVar47;
        auVar47 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x30),
                             (undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x30) = auVar47;
        *(int *)(local_3480 + (ulong)auVar50._4_4_ * 0x10 + 0x1804) =
             *(int *)(local_3480 + (ulong)auVar50._4_4_ * 0x10 + 0x1804) + iVar23;
        lVar19 = (ulong)auVar50._4_4_ * 0xc0;
        auVar47 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x40),
                             (undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x40) = auVar47;
        auVar47 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x50),
                             (undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x50) = auVar47;
        auVar47 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x60),
                             (undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x60) = auVar47;
        auVar47 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x70),
                             (undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x70) = auVar47;
        *(int *)(local_3480 + (ulong)auVar50._8_4_ * 0x10 + 0x1808) =
             *(int *)(local_3480 + (ulong)auVar50._8_4_ * 0x10 + 0x1808) + iVar23;
        lVar19 = (ulong)auVar50._8_4_ * 0xc0;
        auVar47 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x80),
                             (undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x80) = auVar47;
        auVar47 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0x90),
                             (undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0x90) = auVar47;
        auVar47 = vminps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0xa0),
                             (undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0xa0) = auVar47;
        auVar47 = vmaxps_avx(*(undefined1 (*) [16])(local_3480 + lVar19 + 0xb0),
                             (undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_3480 + lVar19 + 0xb0) = auVar47;
      }
    }
  }
  else {
    local_3690.prims = &local_3748;
    local_3750.mapping = (BinMapping<32UL> *)local_3740;
    local_3680[0].my_version = proxy_support;
    local_3680[0].my_traits = (context_traits)0x4;
    local_3680[0].my_node = (intrusive_list_node)(ZEXT816(0) << 0x20);
    local_3680[0].my_name = CUSTOM_CTX;
    local_3690.mapping = local_3750.mapping;
    tbb::detail::r1::initialize(local_3680);
    local_3710[0].my_begin = uVar12;
    local_3710[0].my_end = uVar28;
    local_3710[0].my_grainsize = 0x400;
    local_3760.func = &local_3690;
    local_3760.reduction = &local_3750;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::avx::BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:513:31)>
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80,
               local_3710,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               &local_3760,&local_3750,local_3680);
    cVar18 = tbb::detail::r1::is_group_execution_cancelled(local_3680);
    if (cVar18 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(local_3680);
    BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80);
    auVar49 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar52 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
  }
  lVar19 = local_3740._0_8_ - 1;
  if (lVar19 != 0) {
    lVar24 = local_3740._0_8_ * 0x10;
    pauVar22 = (undefined1 (*) [16])(auStack_3490 + local_3740._0_8_ * 0xc0);
    auVar33 = ZEXT816(0) << 0x40;
    lVar25 = 0;
    auVar47 = auVar52._0_16_;
    auVar31 = auVar49._0_16_;
    lVar27 = lVar19;
    auVar30 = auVar47;
    auVar41 = auVar31;
    auVar42 = auVar47;
    auVar32 = auVar31;
    auVar43 = auVar31;
    auVar36 = auVar47;
    auVar50 = auVar47;
    auVar51 = auVar31;
    do {
      auVar43 = vminps_avx(auVar43,pauVar22[-0xb]);
      auVar47 = vmaxps_avx(auVar47,pauVar22[-10]);
      auVar14 = vminps_avx(auVar49._0_16_,pauVar22[-9]);
      auVar37 = vmaxps_avx(auVar52._0_16_,pauVar22[-8]);
      auVar45 = vsubps_avx(auVar47,auVar43);
      auVar51 = vminps_avx(auVar51,pauVar22[-7]);
      auVar50 = vmaxps_avx(auVar50,pauVar22[-6]);
      auVar31 = vminps_avx(auVar31,pauVar22[-5]);
      auVar39 = vsubps_avx(auVar37,auVar14);
      auVar36 = vmaxps_avx(auVar36,pauVar22[-4]);
      auVar15 = vsubps_avx(auVar50,auVar51);
      auVar44 = vinsertps_avx(auVar15,auVar45,0x4c);
      auVar46 = vshufpd_avx(auVar45,auVar45,1);
      auVar46 = vinsertps_avx(auVar46,auVar15,0x9c);
      auVar34 = vsubps_avx(auVar36,auVar31);
      auVar17 = vunpcklps_avx(auVar45,auVar15);
      auVar45 = vinsertps_avx(auVar34,auVar39,0x4c);
      auVar15 = vshufpd_avx(auVar39,auVar39,1);
      auVar15 = vinsertps_avx(auVar15,auVar34,0x9c);
      auVar39 = vunpcklps_avx(auVar39,auVar34);
      auVar34._0_4_ =
           (auVar17._0_4_ * (auVar44._0_4_ + auVar46._0_4_) + auVar44._0_4_ * auVar46._0_4_ +
           (auVar15._0_4_ + auVar45._0_4_) * auVar39._0_4_ + auVar15._0_4_ * auVar45._0_4_) * 0.5;
      auVar34._4_4_ =
           (auVar17._4_4_ * (auVar44._4_4_ + auVar46._4_4_) + auVar44._4_4_ * auVar46._4_4_ +
           (auVar15._4_4_ + auVar45._4_4_) * auVar39._4_4_ + auVar15._4_4_ * auVar45._4_4_) * 0.5;
      auVar34._8_4_ =
           (auVar17._8_4_ * (auVar44._8_4_ + auVar46._8_4_) + auVar44._8_4_ * auVar46._8_4_ +
           (auVar15._8_4_ + auVar45._8_4_) * auVar39._8_4_ + auVar15._8_4_ * auVar45._8_4_) * 0.5;
      auVar34._12_4_ =
           (auVar17._12_4_ * (auVar44._12_4_ + auVar46._12_4_) + auVar44._12_4_ * auVar46._12_4_ +
           (auVar15._12_4_ + auVar45._12_4_) * auVar39._12_4_ + auVar15._12_4_ * auVar45._12_4_) *
           0.5;
      uVar2 = vmovlps_avx(auVar34);
      *(undefined8 *)(local_3480 + lVar25 + lVar24 + 0x19f0) = uVar2;
      auVar32 = vminps_avx(auVar32,pauVar22[-3]);
      auVar42 = vmaxps_avx(auVar42,pauVar22[-2]);
      auVar41 = vminps_avx(auVar41,pauVar22[-1]);
      auVar30 = vmaxps_avx(auVar30,*pauVar22);
      auVar39 = vsubps_avx(auVar42,auVar32);
      auVar44 = vmovshdup_avx(auVar39);
      auVar45 = vshufpd_avx(auVar39,auVar39,1);
      auVar34 = vsubps_avx(auVar30,auVar41);
      auVar46 = vmovshdup_avx(auVar34);
      auVar15 = vshufpd_avx(auVar34,auVar34,1);
      auVar52 = ZEXT1664(auVar37);
      auVar49 = ZEXT1664(auVar14);
      *(float *)(local_3480 + lVar25 + lVar24 + 0x19f8) =
           ((auVar44._0_4_ + auVar45._0_4_) * auVar39._0_4_ + auVar44._0_4_ * auVar45._0_4_ +
           (auVar15._0_4_ + auVar46._0_4_) * auVar34._0_4_ + auVar15._0_4_ * auVar46._0_4_) * 0.5;
      auVar33 = vpaddd_avx(auVar33,*(undefined1 (*) [16])(local_3480 + lVar25 + lVar24 + 0x17f0));
      *(undefined1 (*) [16])((long)&(&local_3690)[local_3740._0_8_].prims + lVar25) = auVar33;
      *(undefined4 *)((long)&uStack_1a84 + lVar25 + lVar24) = 0;
      lVar25 = lVar25 + -0x10;
      pauVar22 = pauVar22 + -0xc;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
  }
  uVar20 = 0xffffffff;
  auVar41._8_4_ = 0x7f800000;
  auVar41._0_8_ = 0x7f8000007f800000;
  auVar41._12_4_ = 0x7f800000;
  local_3710[0].my_end = 0x7f8000007f800000;
  local_3710[0].my_begin = auVar41._8_8_;
  local_3760 = (anon_class_16_2_ed117de8_conflict16)(ZEXT816(0) << 0x40);
  if (1 < (ulong)local_3740._0_8_) {
    auVar15 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
    auVar49 = ZEXT1664((undefined1  [16])0x0);
    auVar37._8_8_ = 0x100000001;
    auVar37._0_8_ = 0x100000001;
    auVar44._8_4_ = 0x7f800000;
    auVar44._0_8_ = 0x7f8000007f800000;
    auVar44._12_4_ = 0x7f800000;
    auVar33._8_4_ = 0xff800000;
    auVar33._0_8_ = 0xff800000ff800000;
    auVar33._12_4_ = 0xff800000;
    auVar45 = ZEXT816(0) << 0x40;
    pauVar22 = (undefined1 (*) [16])(local_3480 + 0xb0);
    lVar27 = 0;
    auVar51 = auVar44;
    auVar50 = auVar33;
    auVar46 = auVar44;
    auVar32 = auVar44;
    auVar47 = auVar33;
    auVar43 = auVar44;
    auVar36 = auVar33;
    auVar31 = auVar44;
    auVar30 = auVar33;
    auVar41 = auVar44;
    auVar42 = auVar33;
    do {
      auVar43 = vminps_avx(auVar43,pauVar22[-0xb]);
      auVar47 = vmaxps_avx(auVar47,pauVar22[-10]);
      auVar44 = vminps_avx(auVar44,pauVar22[-9]);
      auVar50 = vmaxps_avx(auVar50,pauVar22[-8]);
      auVar51 = vminps_avx(auVar51,pauVar22[-7]);
      auVar33 = vmaxps_avx(auVar33,pauVar22[-6]);
      auVar31 = vminps_avx(auVar31,pauVar22[-5]);
      auVar36 = vmaxps_avx(auVar36,pauVar22[-4]);
      auVar16 = vsubps_avx(auVar47,auVar43);
      auVar34 = vsubps_avx(auVar50,auVar44);
      auVar32 = vminps_avx(auVar32,pauVar22[-3]);
      auVar35 = vsubps_avx(auVar33,auVar51);
      auVar17 = vsubps_avx(auVar36,auVar31);
      auVar42 = vmaxps_avx(auVar42,pauVar22[-2]);
      auVar14 = vinsertps_avx(auVar17,auVar34,0x4c);
      auVar39 = vshufpd_avx(auVar34,auVar34,1);
      auVar46 = vminps_avx(auVar46,pauVar22[-1]);
      auVar39 = vinsertps_avx(auVar39,auVar17,0x9c);
      auVar48 = vunpcklps_avx(auVar34,auVar17);
      auVar30 = vmaxps_avx(auVar30,*pauVar22);
      auVar40 = vsubps_avx(auVar42,auVar32);
      auVar38 = vsubps_avx(auVar30,auVar46);
      auVar34 = vinsertps_avx(auVar35,auVar16,0x4c);
      auVar34 = vshufps_avx(auVar34,auVar38,0xd4);
      auVar17 = vunpckhps_avx(auVar16,auVar35);
      auVar53._0_8_ = auVar17._0_8_;
      auVar53._8_8_ = auVar38._8_8_;
      auVar34 = vinsertps_avx(auVar34,auVar40,0x70);
      auVar17 = vinsertps_avx(auVar53,auVar40,0xb0);
      local_36c0 = auVar48._0_4_;
      fStack_36bc = auVar48._4_4_;
      fStack_36b8 = auVar48._8_4_;
      fStack_36b4 = auVar48._12_4_;
      auVar16 = vunpcklps_avx(auVar16,auVar35);
      auVar16 = vmovlhps_avx(auVar16,auVar38);
      auVar16 = vinsertps_avx(auVar16,auVar40,0x30);
      auVar38._0_4_ = (auVar39._0_4_ + auVar14._0_4_) * local_36c0 + auVar39._0_4_ * auVar14._0_4_;
      auVar38._4_4_ = (auVar39._4_4_ + auVar14._4_4_) * fStack_36bc + auVar39._4_4_ * auVar14._4_4_;
      auVar38._8_4_ = (auVar39._8_4_ + auVar14._8_4_) * fStack_36b8 + auVar39._8_4_ * auVar14._8_4_;
      auVar38._12_4_ =
           (auVar39._12_4_ + auVar14._12_4_) * fStack_36b4 + auVar39._12_4_ * auVar14._12_4_;
      auVar45 = vpaddd_avx(auVar45,*(undefined1 (*) [16])(local_3480 + lVar27 + 0x1800));
      auVar35._0_4_ =
           auVar34._0_4_ * auVar17._0_4_ + (auVar34._0_4_ + auVar17._0_4_) * auVar16._0_4_;
      auVar35._4_4_ =
           auVar34._4_4_ * auVar17._4_4_ + (auVar34._4_4_ + auVar17._4_4_) * auVar16._4_4_;
      auVar35._8_4_ =
           auVar34._8_4_ * auVar17._8_4_ + (auVar34._8_4_ + auVar17._8_4_) * auVar16._8_4_;
      auVar35._12_4_ =
           auVar34._12_4_ * auVar17._12_4_ + (auVar34._12_4_ + auVar17._12_4_) * auVar16._12_4_;
      auVar14 = vpaddd_avx(auVar45,auVar15);
      auVar14 = vpsrld_avx(auVar14,ZEXT416((uint)logBlockSize));
      auVar16 = vshufps_avx(auVar38,auVar35,0xb4);
      auVar39 = vpsrad_avx(auVar14,0x1f);
      auVar48._8_4_ = 0x7fffffff;
      auVar48._0_8_ = 0x7fffffff7fffffff;
      auVar48._12_4_ = 0x7fffffff;
      auVar14 = vpand_avx(auVar48,auVar14);
      auVar17._8_8_ = 0x4f0000004f000000;
      auVar17._0_8_ = 0x4f0000004f000000;
      auVar34 = vpand_avx(auVar17,auVar39);
      auVar14 = vcvtdq2ps_avx(auVar14);
      auVar39 = vpaddd_avx(auVar15,*(undefined1 (*) [16])(local_3680[0].padding + lVar27 + -0x38));
      auVar39 = vpsrld_avx(auVar39,ZEXT416((uint)logBlockSize));
      auVar40 = vpsrad_avx(auVar39,0x1f);
      auVar39 = vpand_avx(auVar48,auVar39);
      auVar39 = vcvtdq2ps_avx(auVar39);
      auVar17 = vpand_avx(auVar17,auVar40);
      auVar40._0_4_ =
           (auVar14._0_4_ + auVar34._0_4_) * (auVar35._0_4_ + auVar16._0_4_) * 0.5 +
           (auVar39._0_4_ + auVar17._0_4_) * *(float *)(local_1a80 + lVar27 + 0x10);
      auVar40._4_4_ =
           (auVar14._4_4_ + auVar34._4_4_) * (auVar35._4_4_ + auVar16._4_4_) * 0.5 +
           (auVar39._4_4_ + auVar17._4_4_) * *(float *)((long)afStack_1a6c + lVar27);
      auVar40._8_4_ =
           (auVar14._8_4_ + auVar34._8_4_) * (auVar35._8_4_ + auVar16._8_4_) * 0.5 +
           (auVar39._8_4_ + auVar17._8_4_) * *(float *)((long)afStack_1a6c + lVar27 + 4);
      auVar40._12_4_ =
           (auVar14._12_4_ + auVar34._12_4_) * (auVar35._12_4_ + auVar16._12_4_) * 0.5 +
           (auVar39._12_4_ + auVar17._12_4_) * *(float *)((long)afStack_1a6c + lVar27 + 8);
      auVar14 = vcmpps_avx(auVar40,auVar41,1);
      auVar41 = vminps_avx(auVar40,auVar41);
      local_3760 = (anon_class_16_2_ed117de8_conflict16)
                   vblendvps_avx(auVar49._0_16_,auVar37,auVar14);
      auVar49 = ZEXT1664((undefined1  [16])local_3760);
      auVar37 = vpsubd_avx(auVar37,_DAT_01febe20);
      pauVar22 = pauVar22 + 0xc;
      lVar27 = lVar27 + 0x10;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  local_3710[0].my_end = auVar41._0_8_;
  local_3710[0].my_begin = auVar41._8_8_;
  fVar29 = INFINITY;
  uVar21 = 0;
  iVar23 = 0;
  do {
    fVar1 = *(float *)((long)&local_3720 + uVar21 * 4);
    if ((((fVar1 != 0.0) || (NAN(fVar1))) &&
        (fVar1 = *(float *)((long)&local_3710[0].my_end + uVar21 * 4), fVar1 < fVar29)) &&
       (iVar11 = *(int *)((long)&local_3760.reduction + uVar21 * 4), iVar11 != 0)) {
      uVar20 = uVar21 & 0xffffffff;
      iVar23 = iVar11;
      fVar29 = fVar1;
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 3);
  __return_storage_ptr__->sah = fVar29;
  __return_storage_ptr__->dim = (int)uVar20;
  (__return_storage_ptr__->field_2).pos = iVar23;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_3740._0_8_;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_3740._16_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = local_3740._24_8_;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_3720._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = local_3720._8_8_;
  __return_storage_ptr__->sah =
       fVar29 * ((set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower
                );
  if ((int)uVar20 == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize)
        {
          ObjectBinner binner(empty);
          const BinMapping<BINS> mapping(set.size(),set.centBounds);
          bin_parallel(binner,set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,mapping);
          Split osplit = binner.best(mapping,logBlockSize);
          osplit.sah *= set.time_range.size();
          if (!osplit.valid()) osplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return osplit;
        }